

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  StringPtr **ppSVar1;
  IdsByNameMap **dependencyParam;
  char cVar2;
  Disposer *pDVar3;
  IdsByNameMap *pIVar4;
  _Hash_node_base *p_Var5;
  PromiseArena *pPVar6;
  PromiseArenaMember *node;
  OwnPromiseNode OVar7;
  char *pcVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  AsyncInputStream *pAVar13;
  undefined4 uVar14;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar15;
  Header *pHVar16;
  void *pvVar17;
  undefined8 *puVar18;
  int __flags_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  HttpHeaderTable *pHVar20;
  StringPtr *__dest;
  undefined4 in_register_00000084;
  void *pvVar21;
  void *__arg;
  __fn *in_R9;
  TransformPromiseNodeBase *this_00;
  TransformPromiseNodeBase *this_01;
  char *in_stack_00000008;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  String statusTextCopy;
  OwnPromiseNode local_100;
  RemoveConst<kj::HttpHeaders::Header> *local_f8;
  Header *pHStack_f0;
  String local_e8;
  OwnPromiseNode local_d0;
  undefined1 local_c8 [40];
  RemoveConst<kj::HttpHeaders::Header> *pRStack_a0;
  Header *pHStack_98;
  char local_90;
  Array<char> *local_88;
  OneWayPipe local_68;
  Maybe<unsigned_long> local_48;
  OwnPromiseNode local_38;
  size_t sVar19;
  
  pvVar21 = (void *)CONCAT44(in_register_00000084,__flags);
  pHVar20 = (HttpHeaderTable *)CONCAT44(in_register_00000034,__fd);
  sVar19 = __n;
  __arg = pvVar21;
  heapString(&local_e8,(long)pvVar21 - 1);
  __flags_00 = (int)sVar19;
  pvVar17 = extraout_RDX;
  if ((long)pvVar21 - 1U != 0) {
    __dest = (StringPtr *)local_e8.content.size_;
    if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
      __dest = (StringPtr *)local_e8.content.ptr;
    }
    memcpy(__dest,(void *)__n,(long)pvVar21 - 1U);
    pvVar17 = extraout_RDX_00;
  }
  HttpHeaders::clone((HttpHeaders *)local_c8,in_R9,pvVar17,__flags_00,__arg);
  heap<kj::HttpHeaders>((kj *)&local_f8,(HttpHeaders *)local_c8);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_c8);
  cVar2 = *in_stack_00000008;
  aVar15 = local_48.ptr.field_1;
  if ((cVar2 == '\x01') &&
     (aVar15.value = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                     (in_stack_00000008 + 8))->value,
     ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(in_stack_00000008 + 8))->value
     == 0)) {
    dependencyParam = &(pHVar20->idsByName).ptr;
    local_c8._8_4_ = (int)__buf;
    local_c8._16_8_ = local_e8.content.ptr;
    local_c8._24_8_ = local_e8.content.size_;
    local_c8._32_8_ = local_e8.content.disposer;
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    pRStack_a0 = local_f8;
    pHStack_98 = pHStack_f0;
    pHStack_f0 = (Header *)0x0;
    local_88 = (Array<char> *)0x0;
    pIVar4 = (pHVar20->idsByName).ptr;
    p_Var5 = (_Hash_node_base *)(pIVar4->map)._M_h._M_bucket_count;
    local_c8._0_8_ = pHVar20;
    local_90 = cVar2;
    if (p_Var5 == (_Hash_node_base *)0x0 || (ulong)((long)pIVar4 - (long)p_Var5) < 0x68) {
      pvVar17 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar17 + 0x398);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)dependencyParam,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7054:26)>
                 ::anon_class_72_5_009bee8d_for_func::operator());
      *(undefined ***)((long)pvVar17 + 0x398) = &PTR_destroy_006d9af0;
      *(undefined8 *)((long)pvVar17 + 0x3b8) = local_c8._0_8_;
      *(undefined4 *)((long)pvVar17 + 0x3c0) = local_c8._8_4_;
      *(undefined8 *)((long)pvVar17 + 0x3c8) = local_c8._16_8_;
      *(undefined8 *)((long)pvVar17 + 0x3d0) = local_c8._24_8_;
      *(undefined8 *)((long)pvVar17 + 0x3d8) = local_c8._32_8_;
      *(RemoveConst<kj::HttpHeaders::Header> **)((long)pvVar17 + 0x3e0) = pRStack_a0;
      *(Header **)((long)pvVar17 + 1000) = pHStack_98;
      *(char *)((long)pvVar17 + 0x3f0) = local_90;
      if (local_90 == '\x01') {
        *(Array<char> **)((long)pvVar17 + 0x3f8) = local_88;
        local_90 = '\0';
      }
      *(void **)((long)pvVar17 + 0x3a0) = pvVar17;
    }
    else {
      (pIVar4->map)._M_h._M_bucket_count = 0;
      this_00 = (TransformPromiseNodeBase *)&pIVar4[-2].map._M_h._M_bucket_count;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)dependencyParam,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7054:26)>
                 ::anon_class_72_5_009bee8d_for_func::operator());
      pIVar4[-2].map._M_h._M_bucket_count = (size_type)&PTR_destroy_006d9af0;
      pIVar4[-2].map._M_h._M_rehash_policy._M_next_resize = local_c8._0_8_;
      *(undefined4 *)&pIVar4[-2].map._M_h._M_single_bucket = local_c8._8_4_;
      pIVar4[-1].map._M_h._M_buckets = (__buckets_ptr)local_c8._16_8_;
      pIVar4[-1].map._M_h._M_bucket_count = local_c8._24_8_;
      pIVar4[-1].map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_c8._32_8_;
      pIVar4[-1].map._M_h._M_element_count = (size_type)pRStack_a0;
      *(Header **)&pIVar4[-1].map._M_h._M_rehash_policy = pHStack_98;
      *(char *)&pIVar4[-1].map._M_h._M_rehash_policy._M_next_resize = local_90;
      if (local_90 == '\x01') {
        pIVar4[-1].map._M_h._M_single_bucket = (__node_base_ptr)local_88;
        local_90 = '\0';
      }
      pIVar4[-2].map._M_h._M_before_begin._M_nxt = p_Var5;
    }
    pHStack_98 = (Header *)0x0;
    local_c8._24_8_ = (Header *)0x0;
    local_c8._16_8_ = (char *)0x0;
    pPVar6 = (this_00->super_PromiseNode).super_PromiseArenaMember.arena;
    local_100.ptr = &this_00->super_PromiseNode;
    if (pPVar6 == (PromiseArena *)0x0 || (ulong)((long)this_00 - (long)pPVar6) < 0x28) {
      pvVar17 = operator_new(0x400);
      this_01 = (TransformPromiseNodeBase *)((long)pvVar17 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,&local_100,kj::_::IdentityFunc<void>::operator());
      *(undefined ***)((long)pvVar17 + 0x3d8) = &PTR_destroy_006d9b48;
      *(void **)((long)pvVar17 + 0x3e0) = pvVar17;
    }
    else {
      (this_00->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
      this_01 = (TransformPromiseNodeBase *)&this_00[-2].continuationTracePtr;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_01,&local_100,kj::_::IdentityFunc<void>::operator());
      this_00[-2].continuationTracePtr = &PTR_destroy_006d9b48;
      this_00[-1].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)pPVar6;
    }
    local_68.in.disposer = (Disposer *)0x587dd6;
    local_68.in.ptr = (AsyncInputStream *)&DAT_00559a08;
    local_68.out.disposer = (Disposer *)0x1000001b8e;
    local_38.ptr = &this_01->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_d0,&local_38,(SourceLocation *)&local_68);
    OVar7.ptr = local_38.ptr;
    if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
      local_38.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
    }
    node = (PromiseArenaMember *)*dependencyParam;
    *dependencyParam = (IdsByNameMap *)local_d0.ptr;
    if (node != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose(node);
    }
    OVar7.ptr = local_100.ptr;
    if ((TransformPromiseNodeBase *)local_100.ptr != (TransformPromiseNodeBase *)0x0) {
      local_100.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
    }
    if (pHStack_98 != (Header *)0x0) {
      pHStack_98 = (Header *)0x0;
      (**(code **)(pRStack_a0->name).content.ptr)();
    }
    uVar11 = local_c8._24_8_;
    uVar10 = local_c8._16_8_;
    if ((char *)local_c8._16_8_ != (char *)0x0) {
      local_c8._16_8_ = (char *)0x0;
      local_c8._24_8_ = (Header *)0x0;
      (*(code *)((_Hash_node_base *)(((StringPtr *)local_c8._32_8_)->content).ptr)->_M_nxt)
                (local_c8._32_8_,uVar10,1,uVar11,uVar11,0);
    }
    puVar18 = (undefined8 *)operator_new(0x10);
    *puVar18 = &PTR_read_006de1f8;
    puVar18[1] = &PTR_write_006de290;
    (this->super_Response)._vptr_Response =
         (_func_int **)&kj::_::HeapDisposer<kj::NullStream>::instance;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)(puVar18 + 1);
  }
  else {
    local_48.ptr.field_1 = aVar15;
    local_48.ptr.isSet = (bool)cVar2;
    newOneWayPipe(&local_68,&local_48);
    ppSVar1 = &(pHVar20->namesById).builder.endPtr;
    *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
    local_c8._0_8_ = &(pHVar20->namesById).builder.pos;
    local_c8._8_8_ = pHVar20;
    Promise<void>::
    attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
              ((Promise<void> *)&local_d0,
               (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
                *)&(pHVar20->idsByName).ptr);
    pHVar16 = (Header *)operator_new(0x28);
    uVar10 = local_c8._8_8_;
    (pHVar16->name).content.ptr = (char *)&PTR_read_006d97b8;
    uVar12 = local_68.in.ptr._0_4_;
    uVar14 = local_68.in.ptr._4_4_;
    local_68.in.ptr = (AsyncInputStream *)0x0;
    *(undefined4 *)&(pHVar16->name).content.size_ = local_68.in.disposer._0_4_;
    *(undefined4 *)((long)&(pHVar16->name).content.size_ + 4) = local_68.in.disposer._4_4_;
    *(undefined4 *)&(pHVar16->value).content.ptr = uVar12;
    *(undefined4 *)((long)&(pHVar16->value).content.ptr + 4) = uVar14;
    *(undefined1 *)&(pHVar16->value).content.size_ = 1;
    pHVar16[1].name.content.ptr = (char *)local_d0.ptr;
    if ((HttpHeaderTable *)local_c8._8_8_ != (HttpHeaderTable *)0x0) {
      local_c8._8_8_ = (StringPtr *)0x0;
      (*(code *)(((((Vector<kj::StringPtr> *)local_c8._0_8_)->builder).ptr)->content).ptr)
                (local_c8._0_8_,
                 (char *)((long)&(((Vector<kj::StringPtr> *)uVar10)->builder).ptr +
                         (long)(((Vector<kj::StringPtr> *)uVar10)->builder).ptr[-1].content.ptr));
    }
    pDVar3 = (pHVar20->idsByName).disposer;
    local_c8._0_4_ = (int)__buf;
    local_c8._8_8_ = (StringPtr *)0x524569;
    if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
      local_c8._8_8_ = local_e8.content.ptr;
    }
    local_c8._16_8_ =
         (long)&((ArrayPtr<const_char> *)local_e8.content.size_)->ptr +
         (ulong)((StringPtr *)local_e8.content.size_ == (StringPtr *)0x0);
    local_c8._24_8_ = pHStack_f0;
    pRStack_a0 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x40);
    (pRStack_a0->name).content.size_ = (size_t)local_f8;
    (pRStack_a0->value).content.ptr = (char *)pHStack_f0;
    pHStack_f0 = (Header *)0x0;
    (pRStack_a0->value).content.size_ = (size_t)local_e8.content.ptr;
    pRStack_a0[1].name.content.ptr = (char *)local_e8.content.size_;
    pRStack_a0[1].name.content.size_ = (size_t)local_e8.content.disposer;
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    pRStack_a0[1].value.content.ptr =
         (char *)&kj::_::
                  HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream>
                  ::instance;
    pRStack_a0[1].value.content.size_ = (size_t)pHVar16;
    (pRStack_a0->name).content.ptr = (char *)&PTR_disposeImpl_006dc640;
    local_c8._32_4_ = 1;
    pHStack_98 = pHVar16;
    (*pDVar3->_vptr_Disposer[2])(pDVar3,local_c8);
    OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
    destroy((OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
             *)(local_c8 + 0x20));
    pAVar13 = local_68.in.ptr;
    *(undefined4 *)&(this->super_Response)._vptr_Response = local_68.out.disposer._0_4_;
    *(undefined4 *)((long)&(this->super_Response)._vptr_Response + 4) = local_68.out.disposer._4_4_;
    *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = local_68.out.ptr._0_4_;
    *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
         local_68.out.ptr._4_4_;
    local_68.out.ptr = (AsyncOutputStream *)0x0;
    if (local_68.in.ptr != (AsyncInputStream *)0x0) {
      local_68.in.ptr = (AsyncInputStream *)0x0;
      (**(local_68.in.disposer)->_vptr_Disposer)
                (local_68.in.disposer,
                 pAVar13->_vptr_AsyncInputStream[-2] + (long)&pAVar13->_vptr_AsyncInputStream);
    }
  }
  if (pHStack_f0 != (Header *)0x0) {
    pHStack_f0 = (Header *)0x0;
    (**(code **)(local_f8->name).content.ptr)();
  }
  sVar9 = local_e8.content.size_;
  pcVar8 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (*(code *)((_Hash_node_base *)
              (((StringPtr *)&(local_e8.content.disposer)->_vptr_ArrayDisposer)->content).ptr)->
              _M_nxt)(local_e8.content.disposer,pcVar8,1,sVar9,sVar9,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<HeadResponseStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<kj::NullStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }